

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiContext *pIVar1;
  ImU32 tab_id_00;
  ImGuiTabBar **ppIVar2;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  byte local_25;
  ImGuiTabBar *tab_bar_00;
  undefined7 in_stack_ffffffffffffffe8;
  
  pIVar1 = GImGui;
  local_25 = 0;
  if (0 < (GImGui->CurrentTabBar).Size) {
    ppIVar2 = ImVector<ImGuiTabBar_*>::back(&GImGui->CurrentTabBar);
    local_25 = ((*ppIVar2)->Flags & 0x100000U) != 0 ^ 0xff;
  }
  local_25 = local_25 & 1;
  if (local_25 != 0) {
    ppIVar2 = ImVector<ImGuiTabBar_*>::back(&pIVar1->CurrentTabBar);
    tab_bar_00 = *ppIVar2;
    tab_id_00 = TabBarCalcTabID((ImGuiTabBar *)CONCAT17(local_25,in_stack_ffffffffffffffe8),
                                (char *)tab_bar_00);
    TabBarRemoveTab(tab_bar_00,tab_id_00);
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = (g.CurrentTabBar.Size > 0) && !(g.CurrentTabBar.back()->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}